

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

void __thiscall mocker::ir::Builder::operator()(Builder *this,BreakStmt *node)

{
  BBLIter BVar1;
  shared_ptr<mocker::ir::Label> *psVar2;
  BBLIter successorBB;
  undefined1 local_38 [8];
  shared_ptr<mocker::ir::Label> loopSuccessor;
  FunctionModule *func;
  BBLIter originBB;
  BreakStmt *node_local;
  Builder *this_local;
  
  BVar1 = BuilderContext::getCurBasicBlock(this->ctx);
  loopSuccessor.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)BuilderContext::getCurFunc(this->ctx);
  psVar2 = BuilderContext::getCurLoopSuccessor(this->ctx);
  std::shared_ptr<mocker::ir::Label>::shared_ptr((shared_ptr<mocker::ir::Label> *)local_38,psVar2);
  BuilderContext::emplaceInst<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>&>
            (this->ctx,(shared_ptr<mocker::ir::Label> *)local_38);
  BVar1 = FunctionModule::insertBBAfter
                    ((FunctionModule *)
                     loopSuccessor.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi,BVar1);
  BuilderContext::setCurBasicBlock(this->ctx,BVar1);
  std::shared_ptr<mocker::ir::Label>::~shared_ptr((shared_ptr<mocker::ir::Label> *)local_38);
  return;
}

Assistant:

void Builder::operator()(const ast::BreakStmt &node) const {
  auto originBB = ctx.getCurBasicBlock();
  FunctionModule &func = ctx.getCurFunc();

  auto loopSuccessor = ctx.getCurLoopSuccessor();
  ctx.emplaceInst<Jump>(loopSuccessor);

  auto successorBB = func.insertBBAfter(originBB);
  ctx.setCurBasicBlock(successorBB);
}